

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O2

bool __thiscall
triangle<double>::is_hit
          (triangle<double> *this,ray<double> *r,double *t_min,double *t_max,hit_rec<double> *rec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  vec3<double> n_out;
  vec3<double> local_58;
  vec3<double> local_38;
  
  dVar13 = (this->v0_).e[0];
  dVar14 = (this->v1_).e[0] - dVar13;
  dVar15 = (this->v0_).e[1];
  dVar16 = (this->v0_).e[2];
  dVar5 = (this->v1_).e[1] - dVar15;
  dVar6 = (this->v1_).e[2] - dVar16;
  dVar7 = (this->v2_).e[1] - dVar15;
  dVar8 = (this->v2_).e[2] - dVar16;
  dVar9 = (this->v2_).e[0] - dVar13;
  dVar1 = (r->dir_).e[0];
  dVar2 = (r->dir_).e[1];
  dVar3 = (r->dir_).e[2];
  dVar17 = dVar2 * dVar8 - dVar7 * dVar3;
  dVar10 = dVar3 * dVar9 - dVar8 * dVar1;
  dVar11 = dVar1 * dVar7 - dVar9 * dVar2;
  dVar12 = dVar6 * dVar11 + dVar14 * dVar17 + dVar5 * dVar10;
  if (1e-06 <= ABS(dVar12)) {
    dVar12 = 1.0 / dVar12;
    dVar13 = (r->o_).e[0] - dVar13;
    dVar15 = (r->o_).e[1] - dVar15;
    dVar16 = (r->o_).e[2] - dVar16;
    dVar10 = (dVar11 * dVar16 + dVar17 * dVar13 + dVar10 * dVar15) * dVar12;
    bVar4 = false;
    if ((0.0 <= dVar10) && (dVar10 <= 1.0)) {
      dVar11 = dVar15 * dVar6 - dVar5 * dVar16;
      dVar16 = dVar16 * dVar14 - dVar6 * dVar13;
      dVar15 = dVar13 * dVar5 - dVar14 * dVar15;
      dVar13 = (dVar3 * dVar15 + dVar1 * dVar11 + dVar2 * dVar16) * dVar12;
      bVar4 = false;
      if ((0.0 <= dVar13) && (bVar4 = false, dVar10 + dVar13 <= 1.0)) {
        dVar12 = dVar12 * (dVar15 * dVar8 + dVar11 * dVar9 + dVar16 * dVar7);
        bVar4 = false;
        if ((*t_min <= dVar12) && (bVar4 = false, dVar12 < *t_max || dVar12 == *t_max)) {
          rec->u = dVar10;
          rec->v = dVar13;
          rec->t = dVar12;
          local_58.e[2] = dVar14 * dVar7 - dVar9 * dVar5;
          local_58.e[0] = dVar5 * dVar8 - dVar7 * dVar6;
          local_58.e[1] = dVar6 * dVar9 - dVar8 * dVar14;
          unit_v<double>(&local_38,&local_58);
          hit_rec<double>::set_face(rec,r,&local_38);
          std::__shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(rec->mat).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>,
                     &(this->mat).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>);
          ray<double>::at(&local_58,r,dVar12);
          (rec->p).e[2] = local_58.e[2];
          (rec->p).e[0] = local_58.e[0];
          (rec->p).e[1] = local_58.e[1];
          bVar4 = true;
        }
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool bound_box(const T&, const T&, BB<T>& out) const override {
    out = BB<T>(point3<T>(std::min<T>({v0_.getX(), v1_.getX(), v2_.getX()}),
                          std::min<T>({v0_.getY(), v1_.getY(), v2_.getY()}),
                          std::min<T>({v0_.getZ(), v1_.getZ(), v2_.getZ()})),
                point3<T>(std::max<T>({v0_.getX(), v1_.getX(), v2_.getX()}),
                          std::max<T>({v0_.getY(), v1_.getY(), v2_.getY()}),
                          std::max<T>({v0_.getZ(), v1_.getZ(), v2_.getZ()})));
    return true;
  }